

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::generateMulti2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t pointsPerCam,double noise,double outlierFraction,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors1,
               vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
               *multiBearingVectors2,
               vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
               *gt)

{
  double *pdVar1;
  double *pdVar2;
  pointer pMVar3;
  pointer pMVar4;
  iterator iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined8 uVar9;
  XprTypeNested pMVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  PointerType ptr;
  DenseStorage<double,__1,__1,__1,_0> *this;
  pointer pMVar21;
  undefined8 *puVar22;
  ulong uVar23;
  ulong uVar24;
  rotation_t *__x;
  ulong uVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM5 [64];
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors2;
  shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  bearingVectors1;
  rotation_t camRotation_1;
  shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> gt_sub;
  undefined1 local_218 [8];
  double *pdStack_210;
  double local_208;
  rotation_t *local_200;
  double *local_1f8;
  undefined8 local_1f0;
  value_type local_1e8;
  value_type local_1d8;
  rotations_t *local_1c8;
  double local_1c0;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> vStack_1a8;
  double dStack_1a0;
  element_type *peStack_198;
  variable_if_dynamic<long,__1> vStack_190;
  double dStack_188;
  double dStack_180;
  translation_t *local_178;
  rotation_t local_168;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  ulong local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  ulong local_c8;
  translation_t *local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  translation_t *local_70;
  Vector3d local_68;
  Vector3d local_48;
  
  local_1c8 = camRotations;
  local_c0 = position2;
  local_78 = outlierFraction;
  local_70 = position1;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_f8 = (double)(pointsPerCam * 3);
    uVar29 = 0;
    __x = rotation1;
    do {
      local_e8 = uVar29;
      this = (DenseStorage<double,__1,__1,__1,_0> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x18,(size_t)__x);
      this->m_data = (double *)0x0;
      this->m_rows = 0;
      this->m_cols = 0;
      if ((pointsPerCam != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)pointsPerCam),0)
          < 3)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar22 = operator_delete;
        __cxa_throw(puVar22,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(this,(Index)local_f8,3,pointsPerCam);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Eigen::Matrix<double,_1,_1,0,_1,_1>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 1),(Matrix<double,__1,__1,_0,__1,__1> *)this);
      auVar44 = in_ZMM5._0_16_;
      if (pointsPerCam != 0) {
        lVar28 = 0;
        sVar27 = 0;
        do {
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          generateRandomPoint((Vector3d *)local_1b8,8.0,4.0);
          auVar44 = in_ZMM5._0_16_;
          pdVar2 = *(double **)
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
          uVar29 = *(Index *)((long)local_168.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[0] + 8);
          uVar24 = uVar29;
          if ((((ulong)(pdVar2 + uVar29 * sVar27) & 7) == 0) &&
             (uVar24 = (ulong)(-((uint)((ulong)(pdVar2 + uVar29 * sVar27) >> 3) & 0x1fffffff) & 7),
             (long)uVar29 <= (long)uVar24)) {
            uVar24 = uVar29;
          }
          uVar25 = uVar29 - uVar24;
          uVar23 = uVar25 + 7;
          if (-1 < (long)uVar25) {
            uVar23 = uVar25;
          }
          if (0 < (long)uVar24) {
            uVar26 = 0;
            do {
              *(undefined8 *)((long)pdVar2 + uVar26 * 8 + uVar29 * lVar28) =
                   *(undefined8 *)(local_1b8 + uVar26 * 8);
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
          }
          uVar23 = (uVar23 & 0xfffffffffffffff8) + uVar24;
          if (7 < (long)uVar25) {
            do {
              uVar9 = *(undefined8 *)(local_1b8 + uVar24 * 8 + 8);
              lVar6 = (&vStack_1a8)[uVar24].m_value;
              dVar8 = (&dStack_1a0)[uVar24];
              pMVar10 = (&peStack_198)[uVar24];
              lVar11 = (&vStack_190)[uVar24].m_value;
              lVar12 = (&vStack_190)[uVar24 + 1].m_value;
              dVar30 = (&dStack_180)[uVar24];
              puVar22 = (undefined8 *)((long)pdVar2 + uVar24 * 8 + uVar29 * lVar28);
              *puVar22 = *(undefined8 *)(local_1b8 + uVar24 * 8);
              puVar22[1] = uVar9;
              puVar22[2] = lVar6;
              puVar22[3] = dVar8;
              puVar22[4] = pMVar10;
              puVar22[5] = lVar11;
              puVar22[6] = lVar12;
              puVar22[7] = dVar30;
              uVar24 = uVar24 + 8;
            } while ((long)uVar24 < (long)uVar23);
          }
          if ((long)uVar23 < (long)uVar29) {
            do {
              *(undefined8 *)((long)pdVar2 + uVar23 * 8 + uVar29 * lVar28) =
                   *(undefined8 *)(local_1b8 + uVar23 * 8);
              uVar23 = uVar23 + 1;
            } while (uVar29 != uVar23);
          }
          sVar27 = sVar27 + 1;
          lVar28 = lVar28 + 8;
        } while (sVar27 != pointsPerCam);
      }
      __x = &local_168;
      in_ZMM5 = ZEXT1664(auVar44);
      std::
      vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::push_back(gt,(value_type *)__x);
      uVar29 = local_e8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1]);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < (ulong)(((long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  auVar44 = in_ZMM5._0_16_;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar29 = 0;
    do {
      local_1d8.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(undefined8 *)
       local_1d8.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_1d8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      *(pointer *)
       ((long)local_1d8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_1d8.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_1d8.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      local_1e8.
      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(0x18);
      *(undefined8 *)
       local_1e8.
       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = 0;
      *(pointer *)
       ((long)local_1e8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 8) = (pointer)0x0;
      *(pointer *)
       ((long)local_1e8.
              super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr + 0x10) = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>*>
                (&local_1e8.
                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_1e8.
                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      auVar44 = in_ZMM5._0_16_;
      pMVar3 = (camOffsets->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar21 = pMVar3 + uVar29;
      local_e8 = *(ulong *)&(pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                            m_storage.m_data;
      dStack_e0 = *(double *)
                   ((long)&(pMVar21->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data + 8);
      local_f8 = *(double *)
                  ((long)&pMVar3[uVar29].
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data + 0x10);
      pMVar4 = (local_1c8->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = *(double *)
             ((long)&pMVar4[uVar29].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data + 0x40);
      pMVar4 = pMVar4 + uVar29;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 8);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x10);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x18);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x20);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x28);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x30);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = *(double *)
             ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                     m_storage.m_data + 0x38);
      local_c8 = uVar29;
      if (pointsPerCam != 0) {
        lVar28 = 0;
        sVar27 = 0;
        do {
          peStack_198 = (gt->
                        super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar29].
                        super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          vStack_1a8.m_value =
               (peStack_198->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
          local_1b8._8_8_ =
               (peStack_198->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data + vStack_1a8.m_value * sVar27;
          vStack_190.m_value = 0;
          local_178 = local_70;
          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
          local_218 = (undefined1  [8])rotation1;
          local_1b8._0_8_ = rotation1;
          dStack_188 = (double)sVar27;
          dStack_180 = (double)vStack_1a8.m_value;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&pdStack_210,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)(local_1b8 + 8));
          local_200 = (rotation_t *)local_218;
          local_1f8 = pdStack_210;
          local_1f0 = 3;
          local_108 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[0];
          dStack_100 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                       m_storage).m_data.array[1];
          local_d8 = *pdStack_210;
          dStack_d0 = pdStack_210[1];
          local_118 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[2];
          dStack_110 = 0.0;
          local_98 = pdStack_210[2];
          dStack_90 = 0.0;
          local_88 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                     m_storage).m_data.array[3];
          dStack_80 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[4];
          local_a8 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                     m_storage).m_data.array[5];
          uStack_a0 = 0;
          local_b8._0_8_ =
               (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->m_storage).
               m_data.array[6];
          local_b8._8_8_ =
               (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->m_storage).
               m_data.array[7];
          local_1c0 = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[8];
          free((void *)pdStack_210[-1]);
          peStack_198 = (gt->
                        super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar29].
                        super___shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          vStack_1a8.m_value =
               (peStack_198->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
          local_1b8._8_8_ =
               (peStack_198->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data + vStack_1a8.m_value * sVar27;
          vStack_190.m_value = 0;
          local_178 = local_c0;
          local_218 = (undefined1  [8])rotation2;
          local_1b8._0_8_ = rotation2;
          dStack_188 = (double)sVar27;
          dStack_180 = (double)vStack_1a8.m_value;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&pdStack_210,
                     (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)(local_1b8 + 8));
          local_1c0 = local_98 * local_1c0 +
                      local_d8 * (double)local_b8._0_8_ + dStack_d0 * (double)local_b8._8_8_;
          auVar7._8_8_ = dStack_110;
          auVar7._0_8_ = local_118;
          auVar20._8_8_ = uStack_a0;
          auVar20._0_8_ = local_a8;
          auVar44 = vunpcklpd_avx(auVar7,auVar20);
          local_88 = local_d8 * local_88;
          local_d8 = local_d8 * local_108 + dStack_d0 * dStack_100 + local_98 * auVar44._0_8_;
          dStack_d0 = local_88 + dStack_d0 * dStack_80 + local_98 * auVar44._8_8_;
          local_200 = (rotation_t *)local_218;
          local_1f8 = pdStack_210;
          local_1f0 = 3;
          local_98 = *pdStack_210;
          dStack_90 = pdStack_210[1];
          local_108 = local_98 *
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[0];
          dStack_100 = dStack_90 *
                       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                       m_storage).m_data.array[1];
          local_118 = local_98 *
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[3];
          dStack_110 = dStack_90 *
                       (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                       m_storage).m_data.array[4];
          local_88 = pdStack_210[2];
          auVar35._8_8_ = 0;
          auVar35._0_8_ =
               (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->m_storage).
               m_data.array[2];
          local_b8 = vmovhps_avx(auVar35,(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *
                                           )local_218)->m_storage).m_data.array[5]);
          local_98 = local_98 *
                     (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                     m_storage).m_data.array[6];
          dStack_90 = dStack_90 *
                      (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                      m_storage).m_data.array[7];
          local_a8 = local_88 *
                     (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_218)->
                     m_storage).m_data.array[8];
          dStack_80 = local_88;
          free((void *)pdStack_210[-1]);
          auVar19._8_8_ = dStack_d0;
          auVar19._0_8_ = local_d8;
          auVar17._8_8_ = dStack_e0;
          auVar17._0_8_ = local_e8;
          auVar44 = vsubpd_avx(auVar19,auVar17);
          dVar8 = local_1c0 - local_f8;
          dVar30 = auVar44._0_8_;
          dVar31 = auVar44._8_8_;
          auVar44._8_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar44._0_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
          auVar44 = vmovhpd_avx(auVar44,local_168.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array[5]);
          local_218 = (undefined1  [8])
                      (dVar8 * auVar44._0_8_ +
                      dVar30 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[0] +
                      dVar31 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[1]);
          pdStack_210 = (double *)
                        (dVar8 * auVar44._8_8_ +
                        dVar30 * local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[3] +
                        dVar31 * local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[4]);
          local_208 = dVar8 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[8] +
                      dVar30 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[6] +
                      dVar31 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[7];
          iVar5._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_1d8.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar5._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_1d8.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_1d8.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar5,(Matrix<double,_3,_1,_0,_3,_1> *)local_218);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] = local_208;
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] = (double)local_218;
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] = (double)pdStack_210;
            *(long *)((long)local_1d8.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_1d8.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          auVar32._0_8_ = local_108 + dStack_100 + (double)local_b8._0_8_ * local_88;
          auVar32._8_8_ = local_118 + dStack_110 + (double)local_b8._8_8_ * dStack_80;
          auVar18._8_8_ = dStack_e0;
          auVar18._0_8_ = local_e8;
          auVar44 = vsubpd_avx(auVar32,auVar18);
          dVar8 = (local_98 + dStack_90 + local_a8) - local_f8;
          dVar30 = auVar44._0_8_;
          dVar31 = auVar44._8_8_;
          auVar15._8_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar15._0_8_ =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
          auVar44 = vmovhpd_avx(auVar15,local_168.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array[5]);
          local_218 = (undefined1  [8])
                      (dVar8 * auVar44._0_8_ +
                      dVar30 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[0] +
                      dVar31 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[1]);
          pdStack_210 = (double *)
                        (dVar8 * auVar44._8_8_ +
                        dVar30 * local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[3] +
                        dVar31 * local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[4]);
          local_208 = dVar8 * local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                              .m_storage.m_data.array[8] +
                      dVar30 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[6] +
                      dVar31 * local_168.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[7];
          iVar5._M_current =
               *(Matrix<double,_3,_1,_0,_3,_1> **)
                ((long)local_1e8.
                       super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 8);
          if (iVar5._M_current ==
              *(Matrix<double,_3,_1,_0,_3,_1> **)
               ((long)local_1e8.
                      super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x10)) {
            std::
            vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                      ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                        *)local_1e8.
                          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,iVar5,(Matrix<double,_3,_1,_0,_3,_1> *)local_218);
          }
          else {
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[2] = local_208;
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[0] = (double)local_218;
            ((iVar5._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
            m_storage.m_data.array[1] = (double)pdStack_210;
            *(long *)((long)local_1e8.
                            super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 8) =
                 *(long *)((long)local_1e8.
                                 super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 8) + 0x18;
          }
          lVar6 = *(long *)local_1d8.
                           super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
          auVar44 = *(undefined1 (*) [16])(lVar6 + lVar28);
          dVar8 = *(double *)(lVar6 + 0x10 + lVar28);
          auVar36._8_8_ = 0;
          auVar36._0_8_ =
               dVar8 * dVar8 + auVar44._0_8_ * auVar44._0_8_ + auVar44._8_8_ * auVar44._8_8_;
          auVar7 = vsqrtpd_avx(auVar36);
          dVar30 = auVar7._0_8_;
          auVar40._8_8_ = dVar30;
          auVar40._0_8_ = dVar30;
          auVar44 = vdivpd_avx(auVar44,auVar40);
          *(undefined1 (*) [16])(lVar6 + lVar28) = auVar44;
          *(double *)(lVar6 + 0x10 + lVar28) = dVar8 / dVar30;
          lVar6 = *(long *)local_1e8.
                           super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
          auVar44 = *(undefined1 (*) [16])(lVar6 + lVar28);
          dVar8 = *(double *)(lVar6 + 0x10 + lVar28);
          auVar37._8_8_ = 0;
          auVar37._0_8_ =
               dVar8 * dVar8 + auVar44._0_8_ * auVar44._0_8_ + auVar44._8_8_ * auVar44._8_8_;
          auVar7 = vsqrtpd_avx(auVar37);
          dVar30 = auVar7._0_8_;
          auVar41._8_8_ = dVar30;
          auVar41._0_8_ = dVar30;
          auVar44 = vdivpd_avx(auVar44,auVar41);
          *(undefined1 (*) [16])(lVar6 + lVar28) = auVar44;
          *(double *)(lVar6 + 0x10 + lVar28) = dVar8 / dVar30;
          if (0.0 < noise) {
            pdVar2 = (double *)
                     (*(long *)local_1d8.
                               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar28);
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar2;
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar2[1];
            local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = *(double *)
                        (*(long *)local_1d8.
                                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x10 + lVar28);
            addNoise((Vector3d *)local_1b8,noise,&local_48);
            lVar6 = *(long *)local_1d8.
                             super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
            *(long *)(lVar6 + 0x10 + lVar28) = vStack_1a8.m_value;
            puVar22 = (undefined8 *)(lVar6 + lVar28);
            *puVar22 = local_1b8._0_8_;
            puVar22[1] = local_1b8._8_8_;
            pdVar2 = (double *)
                     (*(long *)local_1e8.
                               super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + lVar28);
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] = *pdVar2;
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] = pdVar2[1];
            local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] = *(double *)
                        (*(long *)local_1e8.
                                  super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x10 + lVar28);
            addNoise((Vector3d *)local_1b8,noise,&local_68);
            lVar6 = *(long *)local_1e8.
                             super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
            *(long *)(lVar6 + 0x10 + lVar28) = vStack_1a8.m_value;
            puVar22 = (undefined8 *)(lVar6 + lVar28);
            *puVar22 = local_1b8._0_8_;
            puVar22[1] = local_1b8._8_8_;
          }
          auVar44 = in_ZMM5._0_16_;
          sVar27 = sVar27 + 1;
          lVar28 = lVar28 + 0x18;
        } while (pointsPerCam != sVar27);
      }
      in_ZMM5 = ZEXT1664(auVar44);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors1,&local_1d8);
      std::
      vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
      ::push_back(multiBearingVectors2,&local_1e8);
      uVar29 = local_c8;
      if (local_1e8.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1e8.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_1d8.
          super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.
                   super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      auVar44 = in_ZMM5._0_16_;
      uVar29 = uVar29 + 1;
    } while (uVar29 < (ulong)(((long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(camOffsets->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  pMVar21 = (camOffsets->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((camOffsets->
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pMVar21) {
    auVar44 = vcvtusi2sd_avx512f(auVar44,pointsPerCam);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auVar44._0_8_ * local_78;
    auVar44 = vroundsd_avx(auVar33,auVar33,9);
    local_118 = (double)vcvttsd2usi_avx512f(auVar44);
    pdVar2 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array + 1;
    local_108 = 0.0;
    do {
      local_f8 = pMVar21[(long)local_108].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0];
      dStack_f0 = pMVar21[(long)local_108].
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[1];
      dVar8 = pMVar21[(long)local_108].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2];
      pMVar4 = (local_1c8->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_178 = *(translation_t **)
                   ((long)&pMVar4[(long)local_108].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x40);
      pMVar4 = pMVar4 + (long)local_108;
      local_1b8._0_8_ =
           (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      local_1b8._8_8_ =
           *(double *)
            ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                    .m_data + 8);
      vStack_1a8.m_value =
           *(long *)((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x10);
      dStack_1a0 = *(double *)
                    ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x18);
      peStack_198 = *(element_type **)
                     ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + 0x20);
      vStack_190.m_value =
           *(long *)((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x28);
      dStack_188 = *(double *)
                    ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x30);
      dStack_180 = *(double *)
                    ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data + 0x38);
      if (local_118 != 0.0) {
        lVar28 = 0x10;
        local_d8 = (double)((long)local_108 << 4);
        local_e8 = (ulong)local_118;
        do {
          generateRandomPoint((Vector3d *)local_218,8.0,4.0);
          auVar16._8_8_ = dStack_f0;
          auVar16._0_8_ = local_f8;
          auVar13._8_8_ = pdStack_210;
          auVar13._0_8_ = local_218;
          auVar44 = vsubpd_avx(auVar13,*(undefined1 (*) [16])
                                        (local_c0->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        ).m_storage.m_data.array);
          dVar30 = local_208 -
                   (local_c0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[2];
          dVar31 = auVar44._0_8_;
          dVar34 = auVar44._8_8_;
          auVar43._8_8_ = 0;
          auVar43._0_8_ =
               (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[2];
          auVar44 = vmovhpd_avx(auVar43,(rotation2->
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        ).m_storage.m_data.array[5]);
          auVar39._0_8_ =
               dVar30 * auVar44._0_8_ +
               dVar31 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[0] +
               dVar34 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[1];
          auVar39._8_8_ =
               dVar30 * auVar44._8_8_ +
               dVar31 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
               dVar34 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[4];
          auVar44 = vsubpd_avx(auVar39,auVar16);
          lVar6 = **(long **)((long)&(((multiBearingVectors2->
                                       super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + (long)local_d8);
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = auVar44._0_8_;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] = auVar44._8_8_;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] = (dVar30 * (rotation2->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                     dVar31 * (rotation2->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                     dVar34 * (rotation2->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7]) - dVar8;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] = 1.48219693752374e-323;
          auVar14._8_8_ = dStack_1a0;
          auVar14._0_8_ = vStack_1a8.m_value;
          auVar44 = vmovhpd_avx(auVar14,vStack_190.m_value);
          pdVar1 = (double *)(lVar6 + -0x10 + lVar28);
          *pdVar1 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[3] * auVar44._0_8_ +
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1] * (double)local_1b8._0_8_ +
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[2] * (double)local_1b8._8_8_;
          pdVar1[1] = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3] * auVar44._8_8_ +
                      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] * dStack_1a0 +
                      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] * (double)peStack_198;
          *(double *)(lVar6 + lVar28) =
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] * (double)local_178 +
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] * dStack_188 +
               local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] * dStack_180;
          lVar6 = **(long **)((long)&(((multiBearingVectors2->
                                       super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + (long)local_d8);
          auVar44 = *(undefined1 (*) [16])(lVar6 + -0x10 + lVar28);
          dVar30 = *(double *)(lVar6 + lVar28);
          auVar38._8_8_ = 0;
          auVar38._0_8_ =
               dVar30 * dVar30 + auVar44._0_8_ * auVar44._0_8_ + auVar44._8_8_ * auVar44._8_8_;
          auVar7 = vsqrtpd_avx(auVar38);
          dVar31 = auVar7._0_8_;
          auVar42._8_8_ = dVar31;
          auVar42._0_8_ = dVar31;
          auVar44 = vdivpd_avx(auVar44,auVar42);
          *(undefined1 (*) [16])(lVar6 + -0x10 + lVar28) = auVar44;
          *(double *)(lVar6 + lVar28) = dVar30 / dVar31;
          lVar28 = lVar28 + 0x18;
          local_e8 = local_e8 + -1;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (double)local_1b8;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[4] = (double)local_1b8;
          local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] = (double)pdVar2;
        } while (local_e8 != 0);
      }
      local_108 = (double)((long)local_108 + 1);
      pMVar21 = (camOffsets->
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)local_108 <
             (ulong)(((long)(camOffsets->
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar21 >> 3) *
                    -0x5555555555555555));
  }
  return;
}

Assistant:

void
opengv::generateMulti2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t pointsPerCam,
    double noise,
    double outlierFraction,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors1,
    std::vector<std::shared_ptr<bearingVectors_t> > & multiBearingVectors2,
    std::vector<std::shared_ptr<Eigen::MatrixXd> > & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    std::shared_ptr<Eigen::MatrixXd> gt_sub(new Eigen::MatrixXd(3,pointsPerCam));
    for( size_t i = 0; i < pointsPerCam; i++ )
      gt_sub->col(i) = generateRandomPoint( maxDepth, minDepth );
    gt.push_back(gt_sub);
  }

  //iterate through the cameras (pairs)
  for( size_t cam = 0; cam < camOffsets.size(); cam++ )
  {
    //create the bearing-vector arrays for this camera
    std::shared_ptr<bearingVectors_t> bearingVectors1(new bearingVectors_t());
    std::shared_ptr<bearingVectors_t> bearingVectors2(new bearingVectors_t());

    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //now iterate through the points of that camera
    for( size_t i = 0; i < (size_t) pointsPerCam; i++ )
    {
      //project a point into both viewpoint frames
      point_t bodyPoint1 = rotation1.transpose()*(gt[cam]->col(i) - position1);
      point_t bodyPoint2 = rotation2.transpose()*(gt[cam]->col(i) - position2);

      //project that point into the cameras
      bearingVectors1->push_back( camRotation.transpose()*(bodyPoint1 - camOffset) );
      bearingVectors2->push_back( camRotation.transpose()*(bodyPoint2 - camOffset) );

      //normalize the vectors
      (*bearingVectors1)[i] = (*bearingVectors1)[i] / (*bearingVectors1)[i].norm();
      (*bearingVectors2)[i] = (*bearingVectors2)[i] / (*bearingVectors2)[i].norm();

      //add noise
      if( noise > 0.0 )
      {
        (*bearingVectors1)[i] = addNoise(noise,(*bearingVectors1)[i]);
        (*bearingVectors2)[i] = addNoise(noise,(*bearingVectors2)[i]);
      }
    }

    //push back the stuff for this camera
    multiBearingVectors1.push_back(bearingVectors1);
    multiBearingVectors2.push_back(bearingVectors2);
  }

  //add outliers
  size_t outliersPerCam = (size_t) floor(outlierFraction*pointsPerCam);

  //iterate through the cameras
  for(size_t cam = 0; cam < camOffsets.size(); cam++)
  {
    //get the offset and rotation of this camera
    translation_t camOffset = camOffsets[cam];
    rotation_t camRotation = camRotations[cam];

    //add outliers
    for(size_t i = 0; i < outliersPerCam; i++)
    {
      //generate a random point
      point_t p = generateRandomPoint(8,4);

      //transform that point into viewpoint 2 only
      point_t bodyPoint = rotation2.transpose()*(p - position2);

      //use as measurement (outlier)
      (*multiBearingVectors2[cam])[i] =
          camRotation.transpose()*(bodyPoint - camOffset);

      //normalize
      (*multiBearingVectors2[cam])[i] =
          (*multiBearingVectors2[cam])[i] / (*multiBearingVectors2[cam])[i].norm();
    }
  }
}